

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walRestartHdr(Wal *pWal,u32 salt1)

{
  u32 uVar1;
  WalCkptInfo *pWVar2;
  u32 *p;
  u32 *aSalt;
  int i;
  WalCkptInfo *pInfo;
  u32 salt1_local;
  Wal *pWal_local;
  
  pWVar2 = walCkptInfo(pWal);
  p = (pWal->hdr).aSalt;
  pWal->nCkpt = pWal->nCkpt + 1;
  (pWal->hdr).mxFrame = 0;
  uVar1 = sqlite3Get4byte((u8 *)p);
  sqlite3Put4byte((uchar *)p,uVar1 + 1);
  (pWal->hdr).aSalt[1] = salt1;
  walIndexWriteHdr(pWal);
  pWVar2->nBackfill = 0;
  pWVar2->nBackfillAttempted = 0;
  pWVar2->aReadMark[1] = 0;
  for (aSalt._4_4_ = 2; aSalt._4_4_ < 5; aSalt._4_4_ = aSalt._4_4_ + 1) {
    pWVar2->aReadMark[aSalt._4_4_] = 0xffffffff;
  }
  return;
}

Assistant:

static void walRestartHdr(Wal *pWal, u32 salt1){
  volatile WalCkptInfo *pInfo = walCkptInfo(pWal);
  int i;                          /* Loop counter */
  u32 *aSalt = pWal->hdr.aSalt;   /* Big-endian salt values */
  pWal->nCkpt++;
  pWal->hdr.mxFrame = 0;
  sqlite3Put4byte((u8*)&aSalt[0], 1 + sqlite3Get4byte((u8*)&aSalt[0]));
  memcpy(&pWal->hdr.aSalt[1], &salt1, 4);
  walIndexWriteHdr(pWal);
  AtomicStore(&pInfo->nBackfill, 0);
  pInfo->nBackfillAttempted = 0;
  pInfo->aReadMark[1] = 0;
  for(i=2; i<WAL_NREADER; i++) pInfo->aReadMark[i] = READMARK_NOT_USED;
  assert( pInfo->aReadMark[0]==0 );
}